

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::renderQuad
          (SupportedTextureType *this,RenderContext *context,GLint reductionMode)

{
  GLenum GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  deUint16 quadIndices [6];
  vector<float,_std::allocator<float>_> texCoords;
  float position [8];
  ShaderProgram program;
  undefined1 local_1a8 [208];
  VertexArrayBinding vertexArrays [2];
  
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  lVar6 = CONCAT44(extraout_var,iVar3);
  quadIndices[0] = 0;
  quadIndices[1] = 1;
  quadIndices[2] = 2;
  quadIndices[3] = 2;
  quadIndices[4] = 1;
  quadIndices[5] = 3;
  position[4] = 1.0;
  position[5] = -1.0;
  position[6] = 1.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  (*this->_vptr_SupportedTextureType[1])(&texCoords,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"position",&local_2c1);
  glu::va::Float(vertexArrays,(string *)&program,2,4,0,position);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"inTexcoord",&local_2c2);
  glu::va::Float(vertexArrays + 1,(string *)local_1a8,1,4,0,
                 texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&program);
  pcVar2 = *(code **)(lVar6 + 0xb8);
  GVar1 = this->m_type;
  iVar3 = (**this->_vptr_SupportedTextureType)(this);
  (*pcVar2)(GVar1,iVar3);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xb1);
  (**(code **)(lVar6 + 0x1360))(this->m_type,0x2800,0x2601);
  (**(code **)(lVar6 + 0x1360))(this->m_type,0x2801,0x2601);
  (**(code **)(lVar6 + 0x1360))(this->m_type,0x9366,reductionMode);
  glu::makeVtxFragSources((ProgramSources *)local_1a8,&this->m_vertexShader,&this->m_fragmentShader)
  ;
  glu::ShaderProgram::ShaderProgram(&program,context,(ProgramSources *)local_1a8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar6 + 0x1680))(program.m_program.m_program);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glUseProgram failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0xbe);
    pcVar2 = *(code **)(lVar6 + 0x14f0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(program.m_program.m_program,"sampler");
    (*pcVar2)(uVar5,0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glUniform1i failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0xc1);
    (**(code **)(lVar6 + 0x188))(0x4000);
    local_1a8._0_8_ = &DAT_600000001;
    local_1a8._8_4_ = INDEXTYPE_UINT16;
    local_1a8._16_8_ = quadIndices;
    glu::draw(context,program.m_program.m_program,2,vertexArrays,(PrimitiveList *)local_1a8,
              (DrawUtilCallback *)0x0);
    glu::ShaderProgram::~ShaderProgram(&program);
    lVar6 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar6));
      lVar6 = lVar6 + -0x50;
    } while (lVar6 != -0x48);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoords.super__Vector_base<float,_std::allocator<float>_>);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
             ,0xba);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureFilterMinmaxUtils::SupportedTextureType::renderQuad(const glu::RenderContext& context,
																glw::GLint				  reductionMode)
{
	const glw::Functions& gl = context.getFunctions();

	deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	float const position[] = { -1.0f, -1.0f, -1.0f, 1.0f, 1.0f, -1.0f, 1.0f, 1.0f };

	std::vector<float> texCoords = getTexCoords();

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("position", 2, 4, 0, position),
											   glu::va::Float("inTexcoord", 1, 4, 0, texCoords.data()) };

	gl.bindTexture(m_type, this->getTextureGL());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texParameteri(m_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_REDUCTION_MODE_ARB, reductionMode);

	glu::ShaderProgram program(context, glu::makeVtxFragSources(m_vertexShader, m_fragmentShader));
	if (!program.isOk())
	{
		TCU_FAIL("Shader compilation failed");
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram failed");

	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i failed");

	gl.clear(GL_COLOR_BUFFER_BIT);

	glu::draw(context, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), quadIndices));
}